

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

char * fmt::v10::detail::parse_dynamic_spec<char>
                 (char *begin,char *end,int *value,arg_ref<char> *ref,
                 basic_format_parse_context<char> *ctx)

{
  int iVar1;
  char *begin_00;
  char *local_30;
  dynamic_spec_id_handler<char> handler;
  
  local_30 = begin;
  if ((byte)(*begin - 0x30U) < 10) {
    iVar1 = parse_nonnegative_int<char>(&local_30,end,-1);
    if (iVar1 == -1) {
      throw_format_error("number is too big");
    }
    *value = iVar1;
  }
  else if (*begin == '{') {
    begin_00 = begin + 1;
    handler.ctx = ctx;
    handler.ref = ref;
    if (begin_00 != end) {
      local_30 = begin_00;
      if ((*begin_00 == ':') || (*begin_00 == '}')) {
        dynamic_spec_id_handler<char>::on_auto(&handler);
      }
      else {
        begin_00 = do_parse_arg_id<char,fmt::v10::detail::dynamic_spec_id_handler<char>&>
                             (begin_00,end,&handler);
      }
    }
    if ((begin_00 == end) || (*begin_00 != '}')) {
      local_30 = begin_00;
      throw_format_error("invalid format string");
    }
    local_30 = begin_00 + 1;
  }
  return local_30;
}

Assistant:

FMT_CONSTEXPR auto parse_dynamic_spec(const Char* begin, const Char* end,
                                      int& value, arg_ref<Char>& ref,
                                      basic_format_parse_context<Char>& ctx)
    -> const Char* {
  FMT_ASSERT(begin != end, "");
  if ('0' <= *begin && *begin <= '9') {
    int val = parse_nonnegative_int(begin, end, -1);
    if (val != -1)
      value = val;
    else
      throw_format_error("number is too big");
  } else if (*begin == '{') {
    ++begin;
    auto handler = dynamic_spec_id_handler<Char>{ctx, ref};
    if (begin != end) begin = parse_arg_id(begin, end, handler);
    if (begin != end && *begin == '}') return ++begin;
    throw_format_error("invalid format string");
  }
  return begin;
}